

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncTee::ensurePulling(AsyncTee *this)

{
  Type *func;
  undefined1 local_50 [16];
  Disposer *local_40;
  AsyncTee *local_38;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1560:7)>
  _kjDefer1560;
  UnwindDetector unwind;
  AsyncTee *this_local;
  
  if ((this->pulling & 1U) == 0) {
    this->pulling = true;
    UnwindDetector::UnwindDetector((UnwindDetector *)&_kjDefer1560.field_0x14);
    local_40 = (Disposer *)&_kjDefer1560.field_0x14;
    local_38 = this;
    defer<kj::(anonymous_namespace)::AsyncTee::ensurePulling()::_lambda()_1_>
              ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1560:7)>
                *)local_30,(kj *)&local_40,func);
    pull((AsyncTee *)local_50);
    Promise<void>::operator=(&this->pullPromise,(Promise<void> *)local_50);
    Promise<void>::~Promise((Promise<void> *)local_50);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1560:7)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1560:7)>
                 *)local_30);
  }
  return;
}

Assistant:

void ensurePulling() {
    if (!pulling) {
      pulling = true;
      UnwindDetector unwind;
      KJ_DEFER(if (unwind.isUnwinding()) pulling = false);
      pullPromise = pull();
    }
  }